

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  bool bVar8;
  ulong uVar9;
  uint64_t v;
  long *plVar10;
  size_t sVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_50._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_50._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_50._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar8 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,24ul,true,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,8,0x18);
    if ((local_40 != 0) && (!bVar8)) {
      if ((char)local_37 == '\x01') {
        __assert_fail("!was_soo_",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7c2,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      if (local_40 != 0) {
        lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
        plVar10 = (long *)CONCAT44(local_50._12_4_,local_50._8_4_);
        sVar11 = 0;
        do {
          if ((char)local_37 == '\x01') {
            __assert_fail("!was_soo_",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7be,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (-1 < *(char *)(CONCAT44(local_50._4_4_,local_50._0_4_) + sVar11)) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + *plVar10;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0) ^
                           SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8)) + *plVar10;
            uVar13 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
            FVar14 = absl::lts_20240722::container_internal::find_first_non_full<void>
                               (common,uVar13);
            uVar9 = FVar14.offset;
            uVar3 = common->capacity_;
            if (uVar3 <= uVar9) {
              __assert_fail("i < c.capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x70c,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar12 = (ctrl_t)uVar13 & ~kEmpty;
            pcVar4 = (common->heap_or_soo_).heap.control;
            pcVar4[uVar9] = cVar12;
            pcVar4[(ulong)((uint)uVar3 & 0xf) + (uVar9 - 0xf & uVar3)] = cVar12;
            *(long *)(lVar2 + 0x10 + uVar9 * 0x18) = plVar10[2];
            lVar7 = plVar10[1];
            plVar1 = (long *)(lVar2 + uVar9 * 0x18);
            *plVar1 = *plVar10;
            plVar1[1] = lVar7;
          }
          sVar11 = sVar11 + 1;
          plVar10 = plVar10 + 3;
        } while (sVar11 != local_40);
      }
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x18);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, google::protobuf::util::SimpleFieldComparator::Tolerance>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::SimpleFieldComparator::Tolerance>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, google::protobuf::util::SimpleFieldComparator::Tolerance>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::SimpleFieldComparator::Tolerance>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }